

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsimd_generic_trigo.hpp
# Opt level: O2

batch<float,_xsimd::fma3<xsimd::avx2>_> * __thiscall
xsimd::kernel::acos<xsimd::fma3<xsimd::avx2>,float>
          (batch<float,_xsimd::fma3<xsimd::avx2>_> *__return_storage_ptr__,kernel *this,
          batch<float,_xsimd::fma3<xsimd::avx2>_> *self,requires_arch<generic> param_2)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [16];
  batch<float,_xsimd::fma3<xsimd::avx2>_> *pbVar3;
  simd_register<float,_xsimd::avx> sVar4;
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  batch<float,_xsimd::fma3<xsimd::avx2>_> local_60 [2];
  
  auVar6 = *(undefined1 (*) [32])
            (__return_storage_ptr__->super_simd_register<float,_xsimd::fma3<xsimd::avx2>_>).
            super_simd_register<float,_xsimd::avx2>.super_simd_register<float,_xsimd::avx>.data;
  auVar5._8_4_ = 0x7fffffff;
  auVar5._0_8_ = 0x7fffffff7fffffff;
  auVar5._12_4_ = 0x7fffffff;
  auVar5._16_4_ = 0x7fffffff;
  auVar5._20_4_ = 0x7fffffff;
  auVar5._24_4_ = 0x7fffffff;
  auVar5._28_4_ = 0x7fffffff;
  auVar8._8_4_ = 0x3f000000;
  auVar8._0_8_ = 0x3f0000003f000000;
  auVar8._12_4_ = 0x3f000000;
  auVar8._16_4_ = 0x3f000000;
  auVar8._20_4_ = 0x3f000000;
  auVar8._24_4_ = 0x3f000000;
  auVar8._28_4_ = 0x3f000000;
  auVar5 = vandps_avx(auVar6,auVar5);
  auVar1 = vcmpps_avx(auVar8,auVar5,1);
  auVar11._8_4_ = 0xbf000000;
  auVar11._0_8_ = 0xbf000000bf000000;
  auVar11._12_4_ = 0xbf000000;
  auVar11._16_4_ = 0xbf000000;
  auVar11._20_4_ = 0xbf000000;
  auVar11._24_4_ = 0xbf000000;
  auVar11._28_4_ = 0xbf000000;
  auVar2 = vfmadd213ps_fma(auVar5,auVar11,auVar8);
  auVar5 = vsqrtps_avx(ZEXT1632(auVar2));
  sVar4.data = (register_type)vblendvps_avx(auVar6,auVar5,auVar1);
  local_60[0].super_simd_register<float,_xsimd::fma3<xsimd::avx2>_>.
  super_simd_register<float,_xsimd::avx2>.super_simd_register<float,_xsimd::avx>.data =
       (simd_register<float,_xsimd::fma3<xsimd::avx2>_>)
       (simd_register<float,_xsimd::fma3<xsimd::avx2>_>)sVar4.data;
  pbVar3 = asin<float,xsimd::fma3<xsimd::avx2>>(local_60,(xsimd *)this,self);
  auVar6._0_4_ = sVar4.data[0] + sVar4.data[0];
  auVar6._4_4_ = sVar4.data[1] + sVar4.data[1];
  auVar6._8_4_ = sVar4.data[2] + sVar4.data[2];
  auVar6._12_4_ = sVar4.data[3] + sVar4.data[3];
  auVar6._16_4_ = sVar4.data[4] + sVar4.data[4];
  auVar6._20_4_ = sVar4.data[5] + sVar4.data[5];
  auVar6._24_4_ = sVar4.data[6] + sVar4.data[6];
  auVar6._28_4_ = sVar4.data[7] + sVar4.data[7];
  auVar6 = vblendvps_avx((undefined1  [32])sVar4.data,auVar6,auVar1);
  auVar9._8_4_ = 0xbf000000;
  auVar9._0_8_ = 0xbf000000bf000000;
  auVar9._12_4_ = 0xbf000000;
  auVar9._16_4_ = 0xbf000000;
  auVar9._20_4_ = 0xbf000000;
  auVar9._24_4_ = 0xbf000000;
  auVar9._28_4_ = 0xbf000000;
  auVar5 = vcmpps_avx(*(undefined1 (*) [32])
                       (__return_storage_ptr__->
                       super_simd_register<float,_xsimd::fma3<xsimd::avx2>_>).
                       super_simd_register<float,_xsimd::avx2>.
                       super_simd_register<float,_xsimd::avx>.data,auVar9,1);
  auVar10._8_4_ = 0x40490fdb;
  auVar10._0_8_ = 0x40490fdb40490fdb;
  auVar10._12_4_ = 0x40490fdb;
  auVar10._16_4_ = 0x40490fdb;
  auVar10._20_4_ = 0x40490fdb;
  auVar10._24_4_ = 0x40490fdb;
  auVar10._28_4_ = 0x40490fdb;
  auVar7 = vsubps_avx(auVar10,auVar6);
  auVar6 = vblendvps_avx(auVar6,auVar7,auVar5);
  auVar7._8_4_ = 0x3fc90fdb;
  auVar7._0_8_ = 0x3fc90fdb3fc90fdb;
  auVar7._12_4_ = 0x3fc90fdb;
  auVar7._16_4_ = 0x3fc90fdb;
  auVar7._20_4_ = 0x3fc90fdb;
  auVar7._24_4_ = 0x3fc90fdb;
  auVar7._28_4_ = 0x3fc90fdb;
  auVar5 = vsubps_avx(auVar7,auVar6);
  vblendvps_avx(auVar5,auVar6,auVar1);
  return pbVar3;
}

Assistant:

inline batch<T, A> acos(batch<T, A> const& self, requires_arch<generic>) noexcept
        {
            using batch_type = batch<T, A>;
            batch_type x = abs(self);
            auto x_larger_05 = x > batch_type(0.5);
            x = select(x_larger_05, sqrt(fma(batch_type(-0.5), x, batch_type(0.5))), self);
            x = asin(x);
            x = select(x_larger_05, x + x, x);
            x = select(self < batch_type(-0.5), constants::pi<batch_type>() - x, x);
            return select(x_larger_05, x, constants::pio2<batch_type>() - x);
        }